

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_ffqr_df_mipsel(CPUMIPSState_conflict4 *env,uint32_t df,uint32_t wd,uint32_t ws)

{
  float_status *pfVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  float32 fVar6;
  float64 fVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  float_status *status;
  wr_t wx;
  float64 local_40 [2];
  
  lVar3 = (ulong)ws * 0x10 + 0x228;
  if (df == 2) {
    pfVar1 = &(env->active_tc).msa_fp_status;
    lVar9 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar6 = int32_to_float32_mipsel
                        ((int)*(short *)((long)(env->active_fpu).fpr + lVar9 * 2 + lVar3 + -0x228),
                         pfVar1);
      fVar6 = float32_scalbn_mipsel(fVar6,-0xf,pfVar1);
      *(float32 *)((long)local_40 + lVar9 * 4) = fVar6;
      bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar12 = (uint)bVar2;
      if ((fVar6 & 0x7f800000) == 0) {
        uVar12 = uVar12 | 0x10;
      }
      if ((fVar6 & 0x7fffffff) == 0) {
        uVar12 = (uint)bVar2;
      }
      uVar4 = ieee_ex_to_mips_mipsel(uVar12);
      uVar8 = (env->active_tc).msacsr;
      uVar11 = (uVar8 & 0x1000000) >> 0x18 & uVar12 >> 6;
      uVar10 = 3;
      if ((uVar8 & 0x1000000) == 0) {
        uVar10 = uVar11;
      }
      if (uVar12 < 0x80) {
        uVar10 = uVar11;
      }
      uVar10 = uVar10 | uVar4;
      uVar5 = (uint)((uVar8 >> 9 & 1) == 0 & (byte)uVar4 >> 2);
      uVar11 = uVar5 | uVar10;
      uVar12 = uVar4 & 0xfffffffc;
      if ((uVar5 != 0 || (uVar10 & 1) != 0) || (uVar8 & 0x100) != 0) {
        uVar12 = uVar11;
      }
      if ((uVar10 & 2) == 0) {
        uVar12 = uVar11;
      }
      if ((uVar12 & (uVar8 >> 7 & 0x1f | 0x20)) == 0) {
        uVar10 = uVar12 << 0xc;
LAB_008263aa:
        (env->active_tc).msacsr = uVar10 & 0x3f000 | uVar8;
      }
      else if ((uVar8 >> 0x12 & 1) == 0) {
        uVar10 = uVar12 << 0xc | uVar8;
        uVar8 = uVar8 & 0xfff80fff;
        goto LAB_008263aa;
      }
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar12) != 0) {
        fVar6 = float32_default_nan_mipsel(pfVar1);
        *(float32 *)((long)local_40 + lVar9 * 4) = fVar6 & 0xffffffc0 ^ 0x400000 | uVar12;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1c79,
                    "void helper_msa_ffqr_df_mipsel(CPUMIPSState *, uint32_t, uint32_t, uint32_t)");
    }
    pfVar1 = &(env->active_tc).msa_fp_status;
    lVar9 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar7 = int32_to_float64_mipsel
                        (*(int32_t *)((long)(env->active_fpu).fpr + lVar9 * 4 + lVar3 + -0x228),
                         pfVar1);
      fVar7 = float64_scalbn_mipsel(fVar7,-0x1f,pfVar1);
      local_40[lVar9] = fVar7;
      bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar12 = (uint)bVar2;
      if ((fVar7 & 0x7ff0000000000000) == 0) {
        uVar12 = uVar12 | 0x10;
      }
      if ((fVar7 & 0x7fffffffffffffff) == 0) {
        uVar12 = (uint)bVar2;
      }
      uVar4 = ieee_ex_to_mips_mipsel(uVar12);
      uVar8 = (env->active_tc).msacsr;
      uVar11 = (uVar8 & 0x1000000) >> 0x18 & uVar12 >> 6;
      uVar10 = 3;
      if ((uVar8 & 0x1000000) == 0) {
        uVar10 = uVar11;
      }
      if (uVar12 < 0x80) {
        uVar10 = uVar11;
      }
      uVar10 = uVar10 | uVar4;
      uVar5 = (uint)((uVar8 >> 9 & 1) == 0 & (byte)uVar4 >> 2);
      uVar11 = uVar5 | uVar10;
      uVar12 = uVar4 & 0xfffffffc;
      if ((uVar5 != 0 || (uVar10 & 1) != 0) || (uVar8 & 0x100) != 0) {
        uVar12 = uVar11;
      }
      if ((uVar10 & 2) == 0) {
        uVar12 = uVar11;
      }
      if ((uVar12 & (uVar8 >> 7 & 0x1f | 0x20)) == 0) {
        uVar10 = uVar12 << 0xc;
LAB_00826266:
        (env->active_tc).msacsr = uVar10 & 0x3f000 | uVar8;
      }
      else if ((uVar8 >> 0x12 & 1) == 0) {
        uVar10 = uVar12 << 0xc | uVar8;
        uVar8 = uVar8 & 0xfff80fff;
        goto LAB_00826266;
      }
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar12) != 0) {
        fVar7 = float64_default_nan_mipsel(pfVar1);
        local_40[lVar9] = (long)(int)uVar12 | fVar7 & 0xffffffffffffffc0 ^ 0x8000000000000;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 == 1);
  }
  (env->active_fpu).fpr[wd].fd = local_40[0];
  *(float64 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = local_40[1];
  return;
}

Assistant:

void helper_msa_ffqr_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                        uint32_t ws)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    uint32_t i;

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_UNOP(pwx->w[i], from_q16, Rh(pws, i), 32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_UNOP(pwx->d[i], from_q32, Rw(pws, i), 64);
        }
        break;
    default:
        assert(0);
    }

    msa_move_v(pwd, pwx);
}